

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O1

void __thiscall
cmListFileFunction::cmListFileFunction
          (cmListFileFunction *this,string *name,long line,long lineEnd,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args)

{
  undefined1 local_39;
  Implementation *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  long local_28;
  long local_20;
  
  local_38 = (element_type *)0x0;
  local_28 = lineEnd;
  local_20 = line;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
            (&local_30,&local_38,(allocator<cmListFileFunction::Implementation> *)&local_39,name,
             &local_20,&local_28,args);
  (this->Impl).
  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  (this->Impl).
  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Impl).
  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_30._M_pi;
  return;
}

Assistant:

cmListFileFunction(std::string name, long line, long lineEnd,
                     std::vector<cmListFileArgument> args)
    : Impl{ std::make_shared<Implementation>(std::move(name), line, lineEnd,
                                             std::move(args)) }
  {
  }